

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

char * libtorrent::name_for_setting(int s)

{
  byte *pbVar1;
  
  switch((uint)s >> 0xe & 3) {
  case 0:
    pbVar1 = (byte *)(&(anonymous_namespace)::str_settings + (long)s * 7);
    break;
  case 1:
    pbVar1 = BYTE_ARRAY_00465295 + (long)s * 0x20 + 0x1b;
    break;
  case 2:
    pbVar1 = (byte *)(
                     "St23_Sp_counted_ptr_inplaceIN10libtorrent3aux3lsdESaIS2_ELN9__gnu_cxx12_Lock_policyE2EE"
                     + (long)s * 0x20 + 0x57);
    break;
  case 3:
    return "";
  }
  return *(char **)pbVar1;
}

Assistant:

char const* name_for_setting(int s)
	{
		switch (s & settings_pack::type_mask)
		{
			case settings_pack::string_type_base:
				return str_settings[s - settings_pack::string_type_base].name;
			case settings_pack::int_type_base:
				return int_settings[s - settings_pack::int_type_base].name;
			case settings_pack::bool_type_base:
				return bool_settings[s - settings_pack::bool_type_base].name;
		}
		return "";
	}